

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O3

DSA * d2i_DSA_PUBKEY(DSA **a,uchar **pp,long length)

{
  EVP_PKEY *pkey;
  dsa_st *pdVar1;
  CBS cbs;
  CBS local_30;
  
  if (-1 < length) {
    local_30.data = *pp;
    local_30.len = length;
    pkey = (EVP_PKEY *)EVP_parse_public_key(&local_30);
    if (pkey != (EVP_PKEY *)0x0) {
      pdVar1 = EVP_PKEY_get1_DSA(pkey);
      if (pdVar1 != (dsa_st *)0x0) {
        if (a != (DSA **)0x0) {
          DSA_free(*a);
          *a = pdVar1;
        }
        *pp = local_30.data;
      }
      EVP_PKEY_free(pkey);
      return pdVar1;
    }
  }
  return (DSA *)0x0;
}

Assistant:

DSA *d2i_DSA_PUBKEY(DSA **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return nullptr;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  bssl::UniquePtr<EVP_PKEY> pkey(EVP_parse_public_key(&cbs));
  if (pkey == nullptr) {
    return nullptr;
  }
  bssl::UniquePtr<DSA> dsa(EVP_PKEY_get1_DSA(pkey.get()));
  if (dsa == nullptr) {
    return nullptr;
  }
  if (out != nullptr) {
    DSA_free(*out);
    *out = dsa.get();
  }
  *inp = CBS_data(&cbs);
  return dsa.release();
}